

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor.hpp
# Opt level: O0

void __thiscall
soplex::
SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::freeAll(SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *this)

{
  bool bVar1;
  long in_RDI;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  *unaff_retaddr;
  
  if (*(long *)(in_RDI + 0x1b8) != 0) {
    spx_free<int*>((int **)0x52dc46);
  }
  if (*(long *)(in_RDI + 0x1b0) != 0) {
    spx_free<int*>((int **)0x52dc6a);
  }
  if (*(long *)(in_RDI + 0x1c8) != 0) {
    spx_free<int*>((int **)0x52dc92);
  }
  if (*(long *)(in_RDI + 0x1c0) != 0) {
    spx_free<int*>((int **)0x52dcb6);
  }
  if (*(long *)(in_RDI + 0x288) != 0) {
    spx_free<soplex::CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::Dring*>
              ((Dring **)0x52dcde);
  }
  bVar1 = std::
          vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ::empty(unaff_retaddr);
  if (!bVar1) {
    std::
    vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ::clear((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             *)0x52dd14);
  }
  if (*(long *)(in_RDI + 0x2b0) != 0) {
    spx_free<int*>((int **)0x52dd3c);
  }
  if (*(long *)(in_RDI + 0x2b8) != 0) {
    spx_free<int*>((int **)0x52dd64);
  }
  if (*(long *)(in_RDI + 0x2c0) != 0) {
    spx_free<int*>((int **)0x52dd8c);
  }
  if (*(long *)(in_RDI + 0x2c8) != 0) {
    spx_free<int*>((int **)0x52ddb4);
  }
  if (*(long *)(in_RDI + 0x2e8) != 0) {
    spx_free<soplex::CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::Dring*>
              ((Dring **)0x52dde0);
  }
  if (*(long *)(in_RDI + 0x2f8) != 0) {
    spx_free<int*>((int **)0x52de0c);
  }
  if (*(long *)(in_RDI + 0x318) != 0) {
    spx_free<int*>((int **)0x52de38);
  }
  if (*(long *)(in_RDI + 800) != 0) {
    spx_free<int*>((int **)0x52de64);
  }
  if (*(long *)(in_RDI + 0x328) != 0) {
    spx_free<int*>((int **)0x52de90);
  }
  bVar1 = std::
          vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ::empty(unaff_retaddr);
  if (!bVar1) {
    std::
    vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ::clear((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             *)0x52dec6);
  }
  if (*(long *)(in_RDI + 0x1f0) != 0) {
    spx_free<int*>((int **)0x52deee);
  }
  if (*(long *)(in_RDI + 0x208) != 0) {
    spx_free<int*>((int **)0x52df16);
  }
  if (*(long *)(in_RDI + 0x210) != 0) {
    spx_free<int*>((int **)0x52df3e);
  }
  bVar1 = std::
          vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ::empty(unaff_retaddr);
  if (!bVar1) {
    std::
    vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ::clear((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             *)0x52df7c);
  }
  if (*(long *)(in_RDI + 0x238) != 0) {
    spx_free<int*>((int **)0x52dfa4);
  }
  if (*(long *)(in_RDI + 0x240) != 0) {
    spx_free<int*>((int **)0x52dfcc);
  }
  if (*(long *)(in_RDI + 0x248) != 0) {
    spx_free<int*>((int **)0x52dff4);
  }
  if (*(long *)(in_RDI + 0x250) != 0) {
    spx_free<int*>((int **)0x52e01f);
  }
  if (*(long *)(in_RDI + 0x5c8) != 0) {
    (**(code **)**(undefined8 **)(in_RDI + 0x5c8))();
    spx_free<soplex::Timer*>((Timer **)0x52e050);
  }
  if (*(long *)(in_RDI + 0x338) != 0) {
    (**(code **)**(undefined8 **)(in_RDI + 0x338))();
    spx_free<soplex::Timer*>((Timer **)0x52e085);
  }
  return;
}

Assistant:

void SLUFactor<R>::freeAll()
{

   if(this->row.perm)
      spx_free(this->row.perm);

   if(this->row.orig)
      spx_free(this->row.orig);

   if(this->col.perm)
      spx_free(this->col.perm);

   if(this->col.orig)
      spx_free(this->col.orig);

   if(this->u.row.elem)
      spx_free(this->u.row.elem);

   if(!this->u.row.val.empty())
      this->u.row.val.clear();

   if(this->u.row.idx)
      spx_free(this->u.row.idx);

   if(this->u.row.start)
      spx_free(this->u.row.start);

   if(this->u.row.len)
      spx_free(this->u.row.len);

   if(this->u.row.max)
      spx_free(this->u.row.max);

   if(this->u.col.elem)
      spx_free(this->u.col.elem);

   if(this->u.col.idx)
      spx_free(this->u.col.idx);

   if(this->u.col.start)
      spx_free(this->u.col.start);

   if(this->u.col.len)
      spx_free(this->u.col.len);

   if(this->u.col.max)
      spx_free(this->u.col.max);

   if(!this->l.val.empty())
      this->l.val.clear();

   if(this->l.idx)
      spx_free(this->l.idx);

   if(this->l.start)
      spx_free(this->l.start);

   if(this->l.row)
      spx_free(this->l.row);


   if(!this->u.col.val.empty())
      this->u.col.val.clear();

   if(this->l.ridx)
      spx_free(this->l.ridx);

   if(this->l.rbeg)
      spx_free(this->l.rbeg);

   if(this->l.rorig)
      spx_free(this->l.rorig);

   if(this->l.rperm)
      spx_free(this->l.rperm);

   if(solveTime)
   {
      solveTime->~Timer();
      spx_free(solveTime);
   }

   if(this->factorTime)
   {
      this->factorTime->~Timer();
      spx_free(this->factorTime);
   }
}